

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QString,_QMimeTypeXMLData>::emplaceValue<QMimeTypeXMLData>
          (Node<QString,_QMimeTypeXMLData> *this,QMimeTypeXMLData *args)

{
  bool bVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  qsizetype qVar6;
  QArrayData *data;
  QArrayData *pQVar7;
  QArrayData *pQVar8;
  char16_t *pcVar9;
  Data *pDVar10;
  QString *pQVar11;
  qsizetype qVar12;
  Data<QHashPrivate::Node<QString,_QString>_> *__old_val;
  long in_FS_OFFSET;
  QHash<QString,_QString> moved;
  QHash<QString,_QString> local_98;
  QArrayData *local_90;
  char16_t *pcStack_88;
  qsizetype local_80;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QArrayDataPointer<QString> local_60;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = args->hasGlobDeleteAll;
  pDVar2 = (args->name).d.d;
  (args->name).d.d = (Data *)0x0;
  pcVar3 = (args->name).d.ptr;
  (args->name).d.ptr = (char16_t *)0x0;
  qVar4 = (args->name).d.size;
  (args->name).d.size = 0;
  pDVar5 = (args->localeComments).d;
  (args->localeComments).d = (Data *)0x0;
  local_90 = &((args->genericIconName).d.d)->super_QArrayData;
  pcStack_88 = (args->genericIconName).d.ptr;
  (args->genericIconName).d.d = (Data *)0x0;
  (args->genericIconName).d.ptr = (char16_t *)0x0;
  local_80 = (args->genericIconName).d.size;
  (args->genericIconName).d.size = 0;
  local_78 = &((args->iconName).d.d)->super_QArrayData;
  pcStack_70 = (args->iconName).d.ptr;
  (args->iconName).d.d = (Data *)0x0;
  (args->iconName).d.ptr = (char16_t *)0x0;
  local_68 = (args->iconName).d.size;
  (args->iconName).d.size = 0;
  local_60.d = (args->globPatterns).d.d;
  local_60.ptr = (args->globPatterns).d.ptr;
  (args->globPatterns).d.d = (Data *)0x0;
  (args->globPatterns).d.ptr = (QString *)0x0;
  local_60.size = (args->globPatterns).d.size;
  (args->globPatterns).d.size = 0;
  (this->value).hasGlobDeleteAll = bVar1;
  data = &((this->value).name.d.d)->super_QArrayData;
  (this->value).name.d.d = pDVar2;
  (this->value).name.d.ptr = pcVar3;
  (this->value).name.d.size = qVar4;
  local_98.d = (Data *)0x0;
  local_48.d = (Data *)(this->value).localeComments.d;
  (this->value).localeComments.d = pDVar5;
  QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)&local_48);
  qVar12 = local_60.size;
  pQVar11 = local_60.ptr;
  pDVar10 = local_60.d;
  pQVar7 = &((this->value).genericIconName.d.d)->super_QArrayData;
  pcVar3 = (this->value).genericIconName.d.ptr;
  (this->value).genericIconName.d.d = (Data *)local_90;
  (this->value).genericIconName.d.ptr = pcStack_88;
  qVar4 = (this->value).genericIconName.d.size;
  (this->value).genericIconName.d.size = local_80;
  pQVar8 = &((this->value).iconName.d.d)->super_QArrayData;
  pcVar9 = (this->value).iconName.d.ptr;
  (this->value).iconName.d.d = (Data *)local_78;
  (this->value).iconName.d.ptr = pcStack_70;
  qVar6 = (this->value).iconName.d.size;
  (this->value).iconName.d.size = local_68;
  local_60.d = (Data *)0x0;
  local_60.ptr = (QString *)0x0;
  local_60.size = 0;
  local_48.d = (this->value).globPatterns.d.d;
  local_48.ptr = (this->value).globPatterns.d.ptr;
  (this->value).globPatterns.d.d = pDVar10;
  (this->value).globPatterns.d.ptr = pQVar11;
  local_48.size = (this->value).globPatterns.d.size;
  (this->value).globPatterns.d.size = qVar12;
  local_90 = pQVar7;
  pcStack_88 = pcVar3;
  local_80 = qVar4;
  local_78 = pQVar8;
  pcStack_70 = pcVar9;
  local_68 = qVar6;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_98);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }